

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O1

bool __thiscall
cmQtAutoMocUic::JobEvaluateT::MocEvalSource(JobEvaluateT *this,SourceFileHandleT *source)

{
  string *text;
  element_type *filename;
  element_type *peVar1;
  pointer pIVar2;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  byte bVar7;
  bool bVar8;
  int iVar9;
  const_iterator cVar10;
  long *plVar11;
  size_type *psVar12;
  pointer pIVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pIVar16;
  pointer pIVar17;
  char cVar18;
  bool bVar19;
  bool bVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string emsg;
  SourceFileHandleT header;
  string sourceBase;
  SourceFileHandleT header_1;
  string sourceDir;
  string local_1f0;
  string local_1d0;
  byte local_1a9;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  element_type *local_168;
  element_type *local_160;
  SourceFileHandleT *local_158;
  undefined1 local_150 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  pointer local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  undefined1 local_100 [16];
  SourceFileHandleT local_f0;
  SourceFileHandleT local_e0;
  SourceFileHandleT local_d0;
  SourceFileHandleT local_c0;
  SourceFileHandleT local_b0;
  SourceFileHandleT local_a0;
  SourceFileHandleT local_90;
  SourceFileHandleT local_80;
  SourceFileHandleT local_70;
  SourceFileHandleT local_60;
  string local_50;
  
  filename = (source->super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  if (filename->Moc != true) {
    return true;
  }
  peVar1 = (filename->ParseData).
           super___shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (((*(size_type *)((long)&(peVar1->Moc).Macro + 8) == 0) &&
      ((peVar1->Moc).Include.Underscore.
       super__Vector_base<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
       ._M_impl.super__Vector_impl_data._M_start == *(pointer *)((long)&(peVar1->Moc).Include + 8)))
     && (*(pointer *)
          &((vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_> *)
           ((long)&(peVar1->Moc).Include + 0x18))->
           super__Vector_base<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
         == *(pointer *)((long)&(peVar1->Moc).Include + 0x20))) {
    return true;
  }
  local_158 = source;
  cmQtAutoGen::SubDirPrefix(&local_50,&filename->FileName);
  local_168 = filename;
  cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)&local_130,&filename->FileName);
  uVar6 = local_130._8_8_;
  uVar5 = local_130._M_allocated_capacity;
  local_1a9 = *(byte *)((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ +
                       0x272);
  local_160 = peVar1;
  local_110 = (pointer)this;
  if (local_1a9 == 1) {
    pIVar16 = (peVar1->Moc).Include.Underscore.
              super__Vector_base<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pIVar2 = *(pointer *)((long)&(peVar1->Moc).Include + 8);
    if (pIVar16 == pIVar2) goto LAB_0019c113;
    bVar8 = false;
    do {
      pIVar13 = pIVar16 + 1;
      sVar3 = (pIVar16->Base)._M_string_length;
      if (sVar3 == uVar6) {
        if (sVar3 == 0) {
          bVar19 = true;
        }
        else {
          iVar9 = bcmp((pIVar16->Base)._M_dataplus._M_p,(void *)uVar5,sVar3);
          bVar19 = iVar9 == 0;
        }
      }
      else {
        bVar19 = false;
      }
      if (bVar19) {
        bVar8 = true;
        break;
      }
      pIVar16 = pIVar13;
    } while (pIVar13 != pIVar2);
  }
  else {
LAB_0019c113:
    bVar8 = false;
  }
  uVar5 = local_130._8_8_;
  pIVar16 = *(pointer *)
             &((vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_> *)
              ((long)&(local_160->Moc).Include + 0x18))->
              super__Vector_base<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
  ;
  pIVar2 = *(pointer *)((long)&(local_160->Moc).Include + 0x20);
  if (pIVar16 == pIVar2) {
    bVar19 = false;
  }
  else {
    local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_allocated_capacity;
    do {
      pIVar13 = pIVar16 + 1;
      sVar3 = (pIVar16->Base)._M_string_length;
      if (sVar3 == uVar5) {
        if (sVar3 == 0) {
          bVar20 = true;
        }
        else {
          iVar9 = bcmp((pIVar16->Base)._M_dataplus._M_p,local_108,sVar3);
          bVar20 = iVar9 == 0;
        }
      }
      else {
        bVar20 = false;
      }
      bVar19 = false;
      if (bVar20) {
        bVar19 = true;
        break;
      }
      pIVar16 = pIVar13;
    } while (pIVar13 != pIVar2);
  }
  pIVar16 = local_110;
  peVar1 = local_160;
  if ((bVar19) || (*(size_type *)((long)&(local_160->Moc).Macro + 8) == 0 || bVar8)) {
    paVar14 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)&(local_160->Moc).Include.Underscore.
                    super__Vector_base<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
                    ._M_impl.super__Vector_impl_data;
    local_108 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)((long)&(local_160->Moc).Include + 8);
    if (paVar14 != local_108) {
      bVar7 = local_1a9 ^ 1;
      paVar14 = paVar14 + 4;
      do {
        pIVar16 = local_110;
        std::operator+(&local_188,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (paVar14 + -2),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar14)
        ;
        MocFindIncludedHeader((JobEvaluateT *)local_150,&pIVar16->Key,&local_50);
        uVar5 = local_150._0_8_;
        paVar15 = paVar14 + -4;
        if ((element_type *)local_150._0_8_ == (element_type *)0x0) {
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d0,"The file includes the moc file ","");
          cmQtAutoGen::Quoted(&local_1f0,(string *)paVar15);
          std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_1d0);
          MocMessageTestHeaders(&local_1f0,(JobEvaluateT *)pIVar16,&local_188);
          std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          lVar4 = *(long *)(pIVar16->Key)._M_string_length;
          LOCK();
          *(undefined1 *)(lVar4 + 0x808) = 1;
          UNLOCK();
          cmWorkerPool::Abort((cmWorkerPool *)(lVar4 + 0x810));
          cmQtAutoGenerator::Logger::ErrorFile
                    ((Logger *)(*(long *)(pIVar16->Key)._M_string_length + 0x70),MOC,
                     &local_168->FileName,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          cVar18 = '\x01';
        }
        else if (((bVar19 || (bVar7 & 1) != 0) ||
                 (*(size_type *)((long)&(local_160->Moc).Macro + 8) == 0)) ||
                ((sVar3 = *(size_t *)(paVar14->_M_local_buf + 8), sVar3 != local_130._8_8_ ||
                 ((sVar3 != 0 &&
                  (iVar9 = bcmp((void *)paVar14->_M_allocated_capacity,
                                (void *)local_130._M_allocated_capacity,sVar3), iVar9 != 0)))))) {
          lVar4 = *(long *)(pIVar16->Key)._M_string_length;
          cVar18 = '\a';
          if ((*(char *)(lVar4 + 0x270) == '\x01') &&
             (cVar10 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)(lVar4 + 0x300),(key_type *)uVar5),
             cVar10.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur == (__node_type *)0x0)) {
            local_a0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (local_158->
                     super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            local_a0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (local_158->
                 super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if (local_a0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_a0.
                 super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_a0.
                      super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_a0.
                 super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_a0.
                      super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_60.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)local_150._0_8_;
            local_60.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_;
            local_150._0_8_ = (element_type *)0x0;
            local_150._8_8_ = (cmWorkerPool *)0x0;
            bVar8 = MocRegisterIncluded((JobEvaluateT *)local_110,(string *)paVar15,&local_a0,
                                        &local_60,true);
            if ((cmWorkerPool *)
                local_60.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (cmWorkerPool *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_60.
                         super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if (local_a0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_a0.
                         super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            cVar18 = !bVar8;
          }
        }
        else {
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d0,"The file contains a ","");
          cmQtAutoGen::Quoted(&local_1f0,(string *)local_160);
          std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_1d0);
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,local_130._M_allocated_capacity,
                     local_130._8_8_ + local_130._M_allocated_capacity);
          std::__cxx11::string::append((char *)&local_1a8);
          cmQtAutoGen::Quoted(&local_1f0,&local_1a8);
          std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_1d0);
          cmQtAutoGen::Quoted(&local_1f0,(string *)paVar15);
          std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_1d0);
          cmQtAutoGen::Quoted(&local_1f0,&local_168->FileName);
          std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_1d0);
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,local_130._M_allocated_capacity,
                     local_130._8_8_ + local_130._M_allocated_capacity);
          std::__cxx11::string::append((char *)&local_1a8);
          cmQtAutoGen::Quoted(&local_1f0,&local_1a8);
          std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_1d0);
          std::__cxx11::string::append((char *)&local_1d0);
          cmQtAutoGenerator::Logger::WarningFile
                    ((Logger *)(*(long *)(pIVar16->Key)._M_string_length + 0x70),MOC,
                     &local_168->FileName,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          local_80.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (local_158->
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_80.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (local_158->
               super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          if (local_80.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_80.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_80.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_80.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_80.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_90.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (local_158->
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_90.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (local_158->
               super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          if (local_90.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_90.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_90.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_90.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_90.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          bVar8 = MocRegisterIncluded((JobEvaluateT *)pIVar16,(string *)paVar15,&local_80,&local_90,
                                      false);
          if (local_90.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_80.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_80.
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          cVar18 = '\x01';
          if (bVar8) {
            cVar18 = '\a';
          }
        }
        if ((cmWorkerPool *)local_150._8_8_ != (cmWorkerPool *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if ((cVar18 != '\a') && (cVar18 != '\0')) goto LAB_0019d556;
        paVar15 = paVar14 + 2;
        paVar14 = paVar14 + 6;
      } while (paVar15 != local_108);
    }
    pIVar13 = local_110;
    pIVar16 = *(pointer *)
               &((vector<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
                  *)((long)&(local_160->Moc).Include + 0x18))->
                super__Vector_base<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
    ;
    pIVar2 = *(pointer *)((long)&(local_160->Moc).Include + 0x20);
    if (local_1a9 == 0) {
      if (pIVar16 != pIVar2) {
        do {
          pIVar17 = pIVar16 + 1;
          sVar3 = (pIVar16->Base)._M_string_length;
          if ((sVar3 != local_130._8_8_) ||
             ((sVar3 != 0 &&
              (iVar9 = bcmp((pIVar16->Base)._M_dataplus._M_p,(void *)local_130._M_allocated_capacity
                            ,sVar3), iVar9 != 0)))) {
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_188,"The file includes the moc file ","");
            cmQtAutoGen::Quoted(&local_1d0,&pIVar16->Key);
            std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_1d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)&local_188);
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1f0,local_130._M_allocated_capacity,
                       local_130._8_8_ + local_130._M_allocated_capacity);
            std::__cxx11::string::append((char *)&local_1f0);
            cmQtAutoGen::Quoted(&local_1d0,&local_1f0);
            std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_1d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)&local_188);
            lVar4 = *(long *)(pIVar13->Key)._M_string_length;
            LOCK();
            *(undefined1 *)(lVar4 + 0x808) = 1;
            UNLOCK();
            cmWorkerPool::Abort((cmWorkerPool *)(lVar4 + 0x810));
            cmQtAutoGenerator::Logger::ErrorFile
                      ((Logger *)(*(long *)(pIVar13->Key)._M_string_length + 0x70),MOC,
                       &local_168->FileName,&local_188);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) goto LAB_0019d546;
            goto LAB_0019d556;
          }
          if (*(size_type *)((long)&(local_160->Moc).Macro + 8) == 0) {
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_188,"The file includes the moc file ","");
            cmQtAutoGen::Quoted(&local_1d0,&pIVar16->Key);
            std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_1d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)&local_188);
            MocSettingsT::MacrosString_abi_cxx11_
                      (&local_1d0,(MocSettingsT *)(*(long *)(pIVar13->Key)._M_string_length + 0x270)
                      );
            std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_1d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)&local_188);
            cmQtAutoGenerator::Logger::WarningFile
                      ((Logger *)(*(long *)(pIVar13->Key)._M_string_length + 0x70),MOC,
                       &local_168->FileName,&local_188);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
          }
          local_e0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (local_158->
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_e0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (local_158->
               super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          if (local_e0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_e0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_e0.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_e0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_e0.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_f0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (local_158->
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_f0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (local_158->
               super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          if (local_f0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_f0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_f0.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_f0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_f0.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          bVar8 = MocRegisterIncluded((JobEvaluateT *)pIVar13,&pIVar16->Key,&local_e0,&local_f0,
                                      false);
          if (local_f0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_f0.
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_e0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_e0.
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          pIVar16 = pIVar17;
        } while (bVar8 && pIVar17 != pIVar2);
        goto LAB_0019d559;
      }
    }
    else if (pIVar16 != pIVar2) {
      __rhs = &pIVar16->Base;
      local_110 = pIVar2;
      do {
        sVar3 = __rhs->_M_string_length;
        if (sVar3 == local_130._8_8_) {
          if (sVar3 == 0) {
            bVar8 = true;
          }
          else {
            iVar9 = bcmp((__rhs->_M_dataplus)._M_p,(void *)local_130._M_allocated_capacity,sVar3);
            bVar8 = iVar9 == 0;
          }
        }
        else {
          bVar8 = false;
        }
        text = __rhs + -2;
        if ((bVar8) && (*(size_type *)((long)&(local_160->Moc).Macro + 8) != 0)) {
          local_b0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (local_158->
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_b0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (local_158->
               super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          if (local_b0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_b0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_b0.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_b0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_b0.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_c0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (local_158->
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_c0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (local_158->
               super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          if (local_c0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_c0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c0.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_c0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c0.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          bVar8 = MocRegisterIncluded((JobEvaluateT *)pIVar13,text,&local_b0,&local_c0,false);
          if (local_c0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_b0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b0.
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          cVar18 = bVar8 * '\b' + '\x01';
        }
        else {
          std::operator+(&local_188,__rhs + -1,__rhs);
          MocFindIncludedHeader((JobEvaluateT *)local_100,&pIVar13->Key,&local_50);
          uVar5 = local_100._0_8_;
          if ((element_type *)local_100._0_8_ == (element_type *)0x0) {
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1d0,"The file includes the moc file ","");
            cmQtAutoGen::Quoted(&local_1f0,text);
            std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)&local_1d0);
            MocMessageTestHeaders(&local_1f0,(JobEvaluateT *)pIVar13,&local_188);
            std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            lVar4 = *(long *)(pIVar13->Key)._M_string_length;
            LOCK();
            *(undefined1 *)(lVar4 + 0x808) = 1;
            UNLOCK();
            cmWorkerPool::Abort((cmWorkerPool *)(lVar4 + 0x810));
            cmQtAutoGenerator::Logger::ErrorFile
                      ((Logger *)(*(long *)(pIVar13->Key)._M_string_length + 0x70),MOC,
                       &local_168->FileName,&local_1d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            cVar18 = '\x01';
          }
          else {
            lVar4 = *(long *)(pIVar13->Key)._M_string_length;
            cVar18 = '\t';
            if ((*(char *)(lVar4 + 0x270) == '\x01') &&
               (cVar10 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 *)(lVar4 + 0x300),(key_type *)local_100._0_8_),
               cVar10.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur == (__node_type *)0x0)) {
              if ((bVar8) && (*(size_type *)((long)&(local_160->Moc).Macro + 8) == 0)) {
                local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1d0,"The file includes the moc file ","");
                cmQtAutoGen::Quoted(&local_1f0,text);
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p,
                                  local_1f0.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&local_1d0);
                MocSettingsT::MacrosString_abi_cxx11_
                          (&local_1f0,
                           (MocSettingsT *)(*(long *)(pIVar13->Key)._M_string_length + 0x270));
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p,
                                  local_1f0.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&local_1d0);
                cmQtAutoGen::Quoted(&local_1f0,(string *)uVar5);
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p,
                                  local_1f0.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&local_1d0);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_150,"moc_",__rhs);
                plVar11 = (long *)std::__cxx11::string::append((char *)local_150);
                psVar12 = (size_type *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar12) {
                  local_1a8.field_2._M_allocated_capacity = *psVar12;
                  local_1a8.field_2._8_8_ = plVar11[3];
                  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                }
                else {
                  local_1a8.field_2._M_allocated_capacity = *psVar12;
                  local_1a8._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_1a8._M_string_length = plVar11[1];
                *plVar11 = (long)psVar12;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                cmQtAutoGen::Quoted(&local_1f0,&local_1a8);
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p,
                                  local_1f0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                  operator_delete(local_1a8._M_dataplus._M_p,
                                  local_1a8.field_2._M_allocated_capacity + 1);
                }
                if ((element_type *)local_150._0_8_ != (element_type *)(local_150 + 0x10)) {
                  operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
                }
                std::__cxx11::string::append((char *)&local_1d0);
                std::__cxx11::string::append((char *)&local_1d0);
                cmQtAutoGenerator::Logger::WarningFile
                          ((Logger *)(*(long *)(pIVar13->Key)._M_string_length + 0x70),MOC,
                           &local_168->FileName,&local_1d0);
              }
              else {
                local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1d0,"The file includes the moc file ","");
                paVar14 = &local_1a8.field_2;
                cmQtAutoGen::Quoted(&local_1f0,text);
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p,
                                  local_1f0.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&local_1d0);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_150,"moc_",__rhs);
                plVar11 = (long *)std::__cxx11::string::append((char *)local_150);
                psVar12 = (size_type *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar12) {
                  local_1a8.field_2._M_allocated_capacity = *psVar12;
                  local_1a8.field_2._8_8_ = plVar11[3];
                  local_1a8._M_dataplus._M_p = (pointer)paVar14;
                }
                else {
                  local_1a8.field_2._M_allocated_capacity = *psVar12;
                  local_1a8._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_1a8._M_string_length = plVar11[1];
                *plVar11 = (long)psVar12;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                cmQtAutoGen::Quoted(&local_1f0,&local_1a8);
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p,
                                  local_1f0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != paVar14) {
                  operator_delete(local_1a8._M_dataplus._M_p,
                                  local_1a8.field_2._M_allocated_capacity + 1);
                }
                if ((element_type *)local_150._0_8_ != (element_type *)(local_150 + 0x10)) {
                  operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
                }
                std::__cxx11::string::append((char *)&local_1d0);
                cmQtAutoGen::Quoted(&local_1f0,(string *)local_100._0_8_);
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p,
                                  local_1f0.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)&local_1d0);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_150,"moc_",__rhs);
                plVar11 = (long *)std::__cxx11::string::append((char *)local_150);
                psVar12 = (size_type *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar12) {
                  local_1a8.field_2._M_allocated_capacity = *psVar12;
                  local_1a8.field_2._8_8_ = plVar11[3];
                  local_1a8._M_dataplus._M_p = (pointer)paVar14;
                }
                else {
                  local_1a8.field_2._M_allocated_capacity = *psVar12;
                  local_1a8._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_1a8._M_string_length = plVar11[1];
                *plVar11 = (long)psVar12;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                cmQtAutoGen::Quoted(&local_1f0,&local_1a8);
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p,
                                  local_1f0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != paVar14) {
                  operator_delete(local_1a8._M_dataplus._M_p,
                                  local_1a8.field_2._M_allocated_capacity + 1);
                }
                if ((element_type *)local_150._0_8_ != (element_type *)(local_150 + 0x10)) {
                  operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
                }
                std::__cxx11::string::append((char *)&local_1d0);
                std::__cxx11::string::append((char *)&local_1d0);
                cmQtAutoGenerator::Logger::WarningFile
                          ((Logger *)(*(long *)(pIVar13->Key)._M_string_length + 0x70),MOC,
                           &local_168->FileName,&local_1d0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p,
                                local_1d0.field_2._M_allocated_capacity + 1);
              }
              local_d0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (local_158->
                       super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              local_d0.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (local_158->
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_d0.
                  super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_d0.
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_d0.
                        super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_d0.
                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_d0.
                        super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_70.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)local_100._0_8_;
              local_70.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
              local_100._0_8_ = (element_type *)0x0;
              local_100._8_8_ = (cmWorkerPool *)0x0;
              bVar8 = MocRegisterIncluded((JobEvaluateT *)pIVar13,text,&local_d0,&local_70,true);
              if ((cmWorkerPool *)
                  local_70.
                  super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (cmWorkerPool *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_70.
                           super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              if (local_d0.
                  super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_d0.
                           super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              cVar18 = !bVar8;
            }
          }
          if ((cmWorkerPool *)local_100._8_8_ != (cmWorkerPool *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
        }
        if ((cVar18 != '\t') && (cVar18 != '\0')) goto LAB_0019d556;
        pIVar16 = (pointer)(__rhs + 1);
        __rhs = __rhs + 3;
      } while (pIVar16 != local_110);
    }
    bVar8 = true;
  }
  else {
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"The file contains a ","");
    cmQtAutoGen::Quoted(&local_1d0,(string *)peVar1);
    std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_1d0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_188);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,local_130._M_allocated_capacity,
               local_130._8_8_ + local_130._M_allocated_capacity);
    std::__cxx11::string::append((char *)&local_1f0);
    cmQtAutoGen::Quoted(&local_1d0,&local_1f0);
    std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_1d0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_188);
    std::__cxx11::string::_M_append((char *)&local_188,local_130._M_allocated_capacity);
    std::__cxx11::string::append((char *)&local_188);
    lVar4 = *(long *)(pIVar16->Key)._M_string_length;
    LOCK();
    *(undefined1 *)(lVar4 + 0x808) = 1;
    UNLOCK();
    cmWorkerPool::Abort((cmWorkerPool *)(lVar4 + 0x810));
    cmQtAutoGenerator::Logger::ErrorFile
              ((Logger *)(*(long *)(pIVar16->Key)._M_string_length + 0x70),MOC,&local_168->FileName,
               &local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
LAB_0019d546:
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
LAB_0019d556:
    bVar8 = false;
  }
LAB_0019d559:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_allocated_capacity != &local_120) {
    operator_delete((void *)local_130._M_allocated_capacity,local_120._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar8;
}

Assistant:

bool cmQtAutoMocUic::JobEvaluateT::MocEvalSource(
  SourceFileHandleT const& source)
{
  SourceFileT const& sourceFile = *source;
  auto const& parseData = sourceFile.ParseData->Moc;
  if (!sourceFile.Moc ||
      (parseData.Macro.empty() && parseData.Include.Underscore.empty() &&
       parseData.Include.Dot.empty())) {
    return true;
  }

  std::string const sourceDir = SubDirPrefix(sourceFile.FileName);
  std::string const sourceBase =
    cmSystemTools::GetFilenameWithoutLastExtension(sourceFile.FileName);

  // For relaxed mode check if the own "moc_" or ".moc" file is included
  bool const relaxedMode = MocConst().RelaxedMode;
  bool sourceIncludesMocUnderscore = false;
  bool sourceIncludesDotMoc = false;
  // Check if the sources own "moc_" or ".moc" file is included
  if (relaxedMode) {
    for (IncludeKeyT const& incKey : parseData.Include.Underscore) {
      if (incKey.Base == sourceBase) {
        sourceIncludesMocUnderscore = true;
        break;
      }
    }
  }
  for (IncludeKeyT const& incKey : parseData.Include.Dot) {
    if (incKey.Base == sourceBase) {
      sourceIncludesDotMoc = true;
      break;
    }
  }

  // Check if this source needs to be moc processed but doesn't.
  if (!sourceIncludesDotMoc && !parseData.Macro.empty() &&
      !(relaxedMode && sourceIncludesMocUnderscore)) {
    {
      std::string emsg = "The file contains a ";
      emsg += Quoted(parseData.Macro);
      emsg += " macro, but does not include ";
      emsg += Quoted(sourceBase + ".moc");
      emsg += "!\nConsider to\n  - add #include \"";
      emsg += sourceBase;
      emsg += ".moc\"\n  - enable SKIP_AUTOMOC for this file";
      LogFileError(GenT::MOC, sourceFile.FileName, emsg);
    }
    return false;
  }

  // Evaluate "moc_" includes
  for (IncludeKeyT const& incKey : parseData.Include.Underscore) {
    std::string const headerBase = incKey.Dir + incKey.Base;
    SourceFileHandleT header = MocFindIncludedHeader(sourceDir, headerBase);
    if (!header) {
      {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ",\nbut the header could not be found "
               "in the following locations\n";
        msg += MocMessageTestHeaders(headerBase);
        LogFileError(GenT::MOC, sourceFile.FileName, msg);
      }
      return false;
    }
    // The include might be handled differently in relaxed mode
    if (relaxedMode && !sourceIncludesDotMoc && !parseData.Macro.empty() &&
        (incKey.Base == sourceBase)) {
      // The <BASE>.cpp file includes a Qt macro but does not include the
      // <BASE>.moc file. In this case, the moc_<BASE>.cpp should probably
      // be generated from <BASE>.cpp instead of <BASE>.h, because otherwise
      // it won't build. But warn, since this is not how it is supposed to be
      // used. This is for KDE4 compatibility.
      {
        // Issue a warning
        std::string msg = "The file contains a ";
        msg += Quoted(parseData.Macro);
        msg += " macro, but does not include ";
        msg += Quoted(sourceBase + ".moc");
        msg += ".\nInstead it includes ";
        msg += Quoted(incKey.Key);
        msg += ".\nRunning moc on the source\n  ";
        msg += Quoted(sourceFile.FileName);
        msg += "!\nBetter include ";
        msg += Quoted(sourceBase + ".moc");
        msg += " for compatibility with regular mode.\n";
        msg += "This is a CMAKE_AUTOMOC_RELAXED_MODE warning.\n";
        Log().WarningFile(GenT::MOC, sourceFile.FileName, msg);
      }
      // Create mapping
      if (!MocRegisterIncluded(incKey.Key, source, source, false)) {
        return false;
      }
      continue;
    }

    // Check if header is skipped
    if (MocConst().skipped(header->FileName)) {
      continue;
    }
    // Create mapping
    if (!MocRegisterIncluded(incKey.Key, source, std::move(header), true)) {
      return false;
    }
  }

  // Evaluate ".moc" includes
  if (relaxedMode) {
    // Relaxed mode
    for (IncludeKeyT const& incKey : parseData.Include.Dot) {
      // Check if this is the sources own .moc file
      bool const ownMoc = (incKey.Base == sourceBase);
      if (ownMoc && !parseData.Macro.empty()) {
        // Create mapping for the regular use case
        if (!MocRegisterIncluded(incKey.Key, source, source, false)) {
          return false;
        }
        continue;
      }
      // Try to find a header instead but issue a warning.
      // This is for KDE4 compatibility.
      std::string const headerBase = incKey.Dir + incKey.Base;
      SourceFileHandleT header = MocFindIncludedHeader(sourceDir, headerBase);
      if (!header) {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ",\nwhich seems to be the moc file from a different source "
               "file.\nCMAKE_AUTOMOC_RELAXED_MODE: Also a matching header"
               "could not be found in the following locations\n";
        msg += MocMessageTestHeaders(headerBase);
        LogFileError(GenT::MOC, sourceFile.FileName, msg);
        return false;
      }
      // Check if header is skipped
      if (MocConst().skipped(header->FileName)) {
        continue;
      }
      // Issue a warning
      if (ownMoc && parseData.Macro.empty()) {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ", but does not contain a\n";
        msg += MocConst().MacrosString();
        msg += " macro.\nRunning moc on the header\n  ";
        msg += Quoted(header->FileName);
        msg += "!\nBetter include ";
        msg += Quoted("moc_" + incKey.Base + ".cpp");
        msg += " for a compatibility with regular mode.\n";
        msg += "This is a CMAKE_AUTOMOC_RELAXED_MODE warning.\n";
        Log().WarningFile(GenT::MOC, sourceFile.FileName, msg);
      } else {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += " instead of ";
        msg += Quoted("moc_" + incKey.Base + ".cpp");
        msg += ".\nRunning moc on the header\n  ";
        msg += Quoted(header->FileName);
        msg += "!\nBetter include ";
        msg += Quoted("moc_" + incKey.Base + ".cpp");
        msg += " for compatibility with regular mode.\n";
        msg += "This is a CMAKE_AUTOMOC_RELAXED_MODE warning.\n";
        Log().WarningFile(GenT::MOC, sourceFile.FileName, msg);
      }
      // Create mapping
      if (!MocRegisterIncluded(incKey.Key, source, std::move(header), true)) {
        return false;
      }
    }
  } else {
    // Strict mode
    for (IncludeKeyT const& incKey : parseData.Include.Dot) {
      // Check if this is the sources own .moc file
      bool const ownMoc = (incKey.Base == sourceBase);
      if (!ownMoc) {
        // Don't allow <BASE>.moc include other than own in regular mode
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ",\nwhich seems to be the moc file from a different "
               "source file.\nThis is not supported.  Include ";
        msg += Quoted(sourceBase + ".moc");
        msg += " to run moc on this source file.";
        LogFileError(GenT::MOC, sourceFile.FileName, msg);
        return false;
      }
      // Accept but issue a warning if moc isn't required
      if (parseData.Macro.empty()) {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ", but does not contain a ";
        msg += MocConst().MacrosString();
        msg += " macro.";
        Log().WarningFile(GenT::MOC, sourceFile.FileName, msg);
      }
      // Create mapping
      if (!MocRegisterIncluded(incKey.Key, source, source, false)) {
        return false;
      }
    }
  }

  return true;
}